

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QItemViewPaintPair>::emplace<QItemViewPaintPair>
          (QMovableArrayOps<QItemViewPaintPair> *this,qsizetype i,QItemViewPaintPair *args)

{
  QItemViewPaintPair **ppQVar1;
  qsizetype *pqVar2;
  QItemViewPaintPair *pQVar3;
  QModelIndex *pQVar4;
  long lVar5;
  Data *pDVar6;
  long lVar7;
  QAbstractItemModel *pQVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  quintptr qVar16;
  QItemViewPaintPair *pQVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
           super_QArrayDataPointer<QItemViewPaintPair>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0054e84a:
    pQVar8 = (args->index).m.ptr;
    iVar10 = (args->rect).x1.m_i;
    iVar11 = (args->rect).y1.m_i;
    iVar12 = (args->rect).x2.m_i;
    iVar13 = (args->rect).y2.m_i;
    iVar14 = (args->index).r;
    iVar15 = (args->index).c;
    qVar16 = (args->index).i;
    bVar18 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.size != 0;
    QArrayDataPointer<QItemViewPaintPair>::detachAndGrow
              ((QArrayDataPointer<QItemViewPaintPair> *)this,(uint)(i == 0 && bVar18),1,
               (QItemViewPaintPair **)0x0,(QArrayDataPointer<QItemViewPaintPair> *)0x0);
    pQVar17 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
              super_QArrayDataPointer<QItemViewPaintPair>.ptr;
    uStack_40 = (undefined4)qVar16;
    uStack_3c = (undefined4)(qVar16 >> 0x20);
    if (i != 0 || !bVar18) {
      pQVar3 = pQVar17 + i;
      memmove(pQVar3 + 1,pQVar17 + i,
              ((this->super_QGenericArrayOps<QItemViewPaintPair>).
               super_QArrayDataPointer<QItemViewPaintPair>.size - i) * 0x28);
      (pQVar3->rect).x1.m_i = iVar10;
      (pQVar3->rect).y1.m_i = iVar11;
      (pQVar3->rect).x2.m_i = iVar12;
      (pQVar3->rect).y2.m_i = iVar13;
      (pQVar3->index).r = iVar14;
      (pQVar3->index).c = iVar15;
      *(undefined4 *)&(pQVar3->index).i = uStack_40;
      *(undefined4 *)((long)&(pQVar3->index).i + 4) = uStack_3c;
      (pQVar3->index).m.ptr = pQVar8;
      goto LAB_0054e8f8;
    }
    pQVar17[-1].index.m.ptr = pQVar8;
  }
  else {
    lVar7 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
            super_QArrayDataPointer<QItemViewPaintPair>.size;
    if ((lVar7 == i && pDVar6 != (Data *)0x0) &&
       ((pDVar6->super_QArrayData).alloc - lVar7 !=
        ((long)((long)(this->super_QGenericArrayOps<QItemViewPaintPair>).
                      super_QArrayDataPointer<QItemViewPaintPair>.ptr -
               ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x3333333333333333)) {
      pQVar17 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
                super_QArrayDataPointer<QItemViewPaintPair>.ptr;
      pQVar17[lVar7].index.m.ptr = (args->index).m.ptr;
      iVar10 = (args->rect).x1.m_i;
      iVar11 = (args->rect).y1.m_i;
      iVar12 = (args->rect).x2.m_i;
      iVar13 = (args->rect).y2.m_i;
      iVar14 = (args->index).c;
      qVar16 = (args->index).i;
      uVar9 = *(undefined4 *)((long)&(args->index).i + 4);
      pQVar4 = &pQVar17[lVar7].index;
      pQVar4->r = (args->index).r;
      pQVar4->c = iVar14;
      *(int *)&pQVar4->i = (int)qVar16;
      *(undefined4 *)((long)&pQVar4->i + 4) = uVar9;
      pQVar17 = pQVar17 + lVar7;
      (pQVar17->rect).x1.m_i = iVar10;
      (pQVar17->rect).y1.m_i = iVar11;
      (pQVar17->rect).x2.m_i = iVar12;
      (pQVar17->rect).y2.m_i = iVar13;
      goto LAB_0054e8f8;
    }
    if (((i != 0) || (pDVar6 == (Data *)0x0)) ||
       ((QItemViewPaintPair *)
        ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
        (this->super_QGenericArrayOps<QItemViewPaintPair>).
        super_QArrayDataPointer<QItemViewPaintPair>.ptr)) goto LAB_0054e84a;
    pQVar17 = (this->super_QGenericArrayOps<QItemViewPaintPair>).
              super_QArrayDataPointer<QItemViewPaintPair>.ptr;
    pQVar17[-1].index.m.ptr = (args->index).m.ptr;
    iVar10 = (args->rect).x1.m_i;
    iVar11 = (args->rect).y1.m_i;
    iVar12 = (args->rect).x2.m_i;
    iVar13 = (args->rect).y2.m_i;
    iVar14 = (args->index).r;
    iVar15 = (args->index).c;
    uStack_40 = (undefined4)(args->index).i;
    uStack_3c = *(undefined4 *)((long)&(args->index).i + 4);
  }
  pQVar17[-1].index.r = iVar14;
  pQVar17[-1].index.c = iVar15;
  *(undefined4 *)&pQVar17[-1].index.i = uStack_40;
  *(undefined4 *)((long)&pQVar17[-1].index.i + 4) = uStack_3c;
  pQVar17[-1].rect.x1.m_i = iVar10;
  pQVar17[-1].rect.y1.m_i = iVar11;
  pQVar17[-1].rect.x2.m_i = iVar12;
  pQVar17[-1].rect.y2.m_i = iVar13;
  ppQVar1 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
             super_QArrayDataPointer<QItemViewPaintPair>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_0054e8f8:
  pqVar2 = &(this->super_QGenericArrayOps<QItemViewPaintPair>).
            super_QArrayDataPointer<QItemViewPaintPair>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }